

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

void duckdb::RollbackUpdate<duckdb::hugeint_t>(UpdateInfo *base_info,UpdateInfo *rollback_info)

{
  undefined8 *puVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  
  if (rollback_info->N != 0) {
    uVar3 = base_info->max;
    uVar4 = rollback_info->max;
    lVar7 = 0;
    uVar8 = 0;
    do {
      lVar6 = lVar7 + -1;
      puVar10 = (undefined8 *)((long)&(&base_info->next)[lVar7].entry + (ulong)uVar3 * 4);
      do {
        puVar9 = puVar10;
        puVar10 = puVar9 + 2;
        lVar7 = lVar6 + 1;
        lVar2 = lVar6 * 4;
        lVar6 = lVar7;
      } while (*(uint *)((long)&base_info[1].segment + lVar2 + 4) <
               *(uint *)((long)&rollback_info[1].segment + uVar8 * 4));
      puVar1 = (undefined8 *)((long)&rollback_info[1].segment + uVar8 * 0x10 + (ulong)uVar4 * 4);
      uVar5 = puVar1[1];
      *puVar10 = *puVar1;
      puVar9[3] = uVar5;
      uVar8 = uVar8 + 1;
    } while (uVar8 < rollback_info->N);
  }
  return;
}

Assistant:

static void RollbackUpdate(UpdateInfo &base_info, UpdateInfo &rollback_info) {
	auto base_data = base_info.GetData<T>();
	auto base_tuples = base_info.GetTuples();
	auto rollback_data = rollback_info.GetData<T>();
	auto rollback_tuples = rollback_info.GetTuples();
	idx_t base_offset = 0;
	for (idx_t i = 0; i < rollback_info.N; i++) {
		auto id = rollback_tuples[i];
		while (base_tuples[base_offset] < id) {
			base_offset++;
			D_ASSERT(base_offset < base_info.N);
		}
		base_data[base_offset] = rollback_data[i];
	}
}